

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeTest.cpp
# Opt level: O3

unique_ptr<const_oout::Result,_std::default_delete<const_oout::Result>_> __thiscall
oout::SafeTest::result(SafeTest *this)

{
  long in_RSI;
  
  (**(code **)(**(long **)(in_RSI + 8) + 0x10))();
  return (__uniq_ptr_data<const_oout::Result,_std::default_delete<const_oout::Result>,_true,_true>)
         (__uniq_ptr_data<const_oout::Result,_std::default_delete<const_oout::Result>,_true,_true>)
         this;
}

Assistant:

unique_ptr<const Result> SafeTest::result() const
{
	try {
		return test->result();
	} catch (const exception &e) {
		return make_unique<const TestResult>(make_shared<ErrorResult>(e.what()));
	}
}